

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importedentity.cpp
# Opt level: O3

string * __thiscall
libcellml::ImportedEntity::importReference_abi_cxx11_
          (string *__return_storage_ptr__,ImportedEntity *this)

{
  ImportedEntityImpl *pIVar1;
  pointer pcVar2;
  
  pIVar1 = this->mPimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pIVar1->mImportReference)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pIVar1->mImportReference)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ImportedEntity::importReference() const
{
    return mPimpl->mImportReference;
}